

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O2

bool MTCB(void *a_context,ON__INT_PTR a_id)

{
  ON_3dPoint *this;
  ON_3dPoint *__return_storage_ptr__;
  int vertex_index;
  double dVar1;
  double d1;
  ON_3dPoint from_pt;
  ON_3dPoint to_pt;
  bool bVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  long lStackY_1d0;
  double t1;
  long local_180;
  ON_MeshFace *local_178;
  double t0;
  undefined8 *local_168;
  ON__INT_PTR local_160;
  undefined8 *local_158;
  double pivot_ratio;
  ON_3dex fcis [2];
  ON_3dPoint ptPV;
  double t;
  long local_100;
  double local_f8;
  double local_f0;
  double local_e8;
  ON_3dPoint ptV;
  ON_Line edge;
  ON_3dPoint local_98;
  ON_3dPoint ptE;
  ON_3dVector local_60;
  ON_3dVector local_48;
  
  bVar2 = true;
  if (a_context != (void *)0x0) {
    *(undefined1 *)((long)a_context + 0x70) = 0;
    uVar4 = (uint)a_id;
    if ((-1 < (int)uVar4) && ((int)uVar4 < *(int *)(*a_context + 0x50))) {
      local_178 = (ON_MeshFace *)((ulong)(uVar4 & 0x7fffffff) * 0x10 + *(long *)(*a_context + 0x48))
      ;
      local_160 = a_id;
      bVar2 = ON_MeshFace::IsTriangle(local_178);
      uVar5 = 4 - bVar2;
      this = (ON_3dPoint *)((long)a_context + 8);
      local_168 = (undefined8 *)((long)a_context + 0x48);
      uVar4 = bVar2 ^ 3;
      local_180 = -(ulong)uVar5;
      for (lVar6 = 9; local_180 + lVar6 != 9; lVar6 = lVar6 + 1) {
        ON_Mesh::Vertex(&ptV,*a_context,local_178->vi[lVar6 + -9]);
        dVar1 = ON_3dPoint::DistanceTo(&ptV,this);
        if (dVar1 < *(double *)((long)a_context + 0x68)) {
          *(double *)((long)a_context + 0x68) = dVar1;
          *(int *)((long)a_context + 0x40) = (int)local_160;
          local_168[2] = 0;
          local_168[3] = 0;
          *local_168 = 0;
          local_168[1] = 0;
          *(undefined8 *)((long)a_context + lVar6 * 8) = 0x3ff0000000000000;
        }
        lVar7 = (long)((int)uVar4 % (int)uVar5);
        ON_Mesh::Vertex(&ptPV,*a_context,local_178->vi[lVar7]);
        from_pt.y = ptPV.y;
        from_pt.x = ptPV.x;
        from_pt.z = ptPV.z;
        to_pt.y = ptV.y;
        to_pt.x = ptV.x;
        to_pt.z = ptV.z;
        ON_Line::ON_Line(&edge,from_pt,to_pt);
        t = 0.0;
        bVar2 = ON_Line::ClosestPointTo(&edge,this,&t);
        if (((bVar2) && (0.0 <= t)) && (t <= 1.0)) {
          ON_Line::PointAt(&ptE,&edge,t);
          dVar1 = ON_3dPoint::DistanceTo(&ptE,this);
          if (dVar1 < *(double *)((long)a_context + 0x68)) {
            *(double *)((long)a_context + 0x68) = dVar1;
            *(int *)((long)a_context + 0x40) = (int)local_160;
            local_168[2] = 0;
            local_168[3] = 0;
            *local_168 = 0;
            local_168[1] = 0;
            *(double *)((long)a_context + lVar6 * 8) = t;
            *(double *)((long)a_context + lVar7 * 8 + 0x48) = 1.0 - t;
          }
        }
        ON_Line::~ON_Line(&edge);
        uVar4 = uVar4 + 1;
      }
      ON_3dex::ON_3dex(fcis,0,1,2);
      fcis[1].k = ON_3dex::Unset.k;
      fcis[1].i = ON_3dex::Unset.i;
      fcis[1].j = ON_3dex::Unset.j;
      bVar2 = ON_MeshFace::IsQuad(local_178);
      if (bVar2) {
        ON_3dex::ON_3dex((ON_3dex *)&edge,0,3,2);
        fcis[1].k = edge.from.y._0_4_;
        fcis[1]._0_8_ = edge.from.x;
        lStackY_1d0 = 2;
      }
      else {
        lStackY_1d0 = 1;
      }
      local_100 = lStackY_1d0 * 0xc;
      local_158 = (undefined8 *)a_context;
      for (local_180 = 0; local_100 != local_180; local_180 = local_180 + 0xc) {
        __return_storage_ptr__ = &edge.to;
        iVar3 = local_178->vi[*(int *)((long)&fcis[0].j + local_180)];
        vertex_index = local_178->vi[*(int *)((long)&fcis[0].k + local_180)];
        ON_Mesh::Vertex(&edge.from,*a_context,local_178->vi[*(int *)((long)&fcis[0].i + local_180)])
        ;
        ON_Mesh::Vertex(__return_storage_ptr__,*a_context,iVar3);
        ON_Mesh::Vertex(&local_98,*a_context,vertex_index);
        t0 = 0.0;
        t1 = 0.0;
        ON_3dPoint::operator-((ON_3dVector *)&ptV,__return_storage_ptr__,&edge.from);
        dVar1 = ON_3dVector::LengthSquared((ON_3dVector *)&ptV);
        ON_3dPoint::operator-((ON_3dVector *)&ptV,__return_storage_ptr__,&edge.from);
        ON_3dPoint::operator-((ON_3dVector *)&ptPV,&local_98,&edge.from);
        local_e8 = ON_DotProduct((ON_3dVector *)&ptV,(ON_3dVector *)&ptPV);
        ON_3dPoint::operator-((ON_3dVector *)&ptV,this,&edge.from);
        ON_3dPoint::operator-((ON_3dVector *)&ptPV,__return_storage_ptr__,&edge.from);
        local_f0 = ON_DotProduct((ON_3dVector *)&ptV,(ON_3dVector *)&ptPV);
        ON_3dPoint::operator-((ON_3dVector *)&ptV,&local_98,&edge.from);
        local_f8 = ON_3dVector::LengthSquared((ON_3dVector *)&ptV);
        ON_3dPoint::operator-((ON_3dVector *)&ptV,this,&edge.from);
        ON_3dPoint::operator-((ON_3dVector *)&ptPV,&local_98,&edge.from);
        d1 = ON_DotProduct((ON_3dVector *)&ptV,(ON_3dVector *)&ptPV);
        pivot_ratio = 0.0;
        iVar3 = ON_Solve2x2(dVar1,local_e8,local_e8,local_f8,local_f0,d1,&t0,&t1,&pivot_ratio);
        dVar1 = t0;
        a_context = local_158;
        if (iVar3 == 2) {
          if (pivot_ratio < 0.01) {
            ON_3dPoint::operator-((ON_3dVector *)&t,&edge.to,&edge.from);
            operator*((ON_3dVector *)&ptE,dVar1,(ON_3dVector *)&t);
            ON_3dPoint::operator+(&ptPV,&edge.from,(ON_3dVector *)&ptE);
            dVar1 = t1;
            ON_3dPoint::operator-(&local_60,&local_98,&edge.from);
            operator*(&local_48,dVar1,&local_60);
            ON_3dPoint::operator+(&ptV,&ptPV,&local_48);
            ON_3dPoint::operator-((ON_3dVector *)&ptPV,this,&ptV);
            dVar1 = ON_3dVector::LengthAndUnitize((ON_3dVector *)&ptPV);
            if (1e-12 <= dVar1) {
              ON_3dPoint::operator-((ON_3dVector *)&t,&local_98,&edge.from);
              ON_3dPoint::operator-(&local_48,&local_98,&edge.to);
              ON_CrossProduct((ON_3dVector *)&ptE,(ON_3dVector *)&t,&local_48);
              bVar2 = ON_3dVector::Unitize((ON_3dVector *)&ptE);
              a_context = local_158;
              if ((!bVar2) ||
                 (dVar1 = ON_DotProduct((ON_3dVector *)&ptE,(ON_3dVector *)&ptPV),
                 a_context = local_158, ABS(dVar1) < 0.99)) goto LAB_004f48e1;
            }
          }
          a_context = local_158;
          dVar1 = t0;
          lVar6 = local_180;
          local_180 = lVar6;
          if ((0.0 <= t0) && ((0.0 <= t1 && (t1 + t0 <= 1.0)))) {
            ON_3dPoint::operator-((ON_3dVector *)&t,&edge.to,&edge.from);
            operator*((ON_3dVector *)&ptE,dVar1,(ON_3dVector *)&t);
            ON_3dPoint::operator+(&ptPV,&edge.from,(ON_3dVector *)&ptE);
            dVar1 = t1;
            ON_3dPoint::operator-(&local_60,&local_98,&edge.from);
            operator*(&local_48,dVar1,&local_60);
            ON_3dPoint::operator+(&ptV,&ptPV,&local_48);
            dVar1 = ON_3dPoint::DistanceTo(&ptV,this);
            local_180 = lVar6;
            if (dVar1 < *(double *)((long)a_context + 0x68)) {
              *(double *)((long)a_context + 0x68) = dVar1;
              *(int *)((long)a_context + 0x40) = (int)local_160;
              local_168[2] = 0;
              local_168[3] = 0;
              *local_168 = 0;
              local_168[1] = 0;
              *(double *)((long)a_context + ((long)*(int *)((long)&fcis[0].i + lVar6) + 9) * 8) =
                   (1.0 - t0) - t1;
              *(double *)((long)a_context + ((long)*(int *)((long)&fcis[0].j + lVar6) + 9) * 8) = t0
              ;
              *(double *)((long)a_context + ((long)*(int *)((long)&fcis[0].k + lVar6) + 9) * 8) = t1
              ;
            }
          }
        }
LAB_004f48e1:
      }
      dVar1 = *(double *)((long)a_context + 0x68);
      bVar2 = *(double *)((long)a_context + 0x38) <= dVar1;
      if (dVar1 < *(double *)((long)a_context + 0x38)) {
        *(double *)((long)a_context + 0x38) = dVar1;
        *(undefined1 *)((long)a_context + 0x70) = 1;
      }
    }
  }
  return bVar2;
}

Assistant:

bool ON_CALLBACK_CDECL MTCB(void* a_context, ON__INT_PTR a_id)
{
  ON__MTCBDATA* pData = (ON__MTCBDATA*)a_context;
  if (nullptr == pData)
    return true;
  pData->m_bRestart = false;
  const int fi = (int)a_id;
  if (fi < 0 || fi >= pData->m_pMesh->m_F.Count())
    return true;
  const ON_MeshFace& face = pData->m_pMesh->m_F[fi];
  const int fcc = face.IsTriangle() ? 3 : 4;
  for (int fci = 0; fci < fcc; fci++)
  {
    // Distance to vertex at corner fci
    const ON_3dPoint ptV = pData->m_pMesh->Vertex(face.vi[fci]);
    const double distV = ptV.DistanceTo(pData->m_pt);
    if (distV < pData->m_dist)
    {
      pData->m_dist = distV;
      pData->m_face_index = fi;
      pData->m_t[0] = pData->m_t[1] = pData->m_t[2] = pData->m_t[3] = 0.0;
      pData->m_t[fci] = 1.0;
    }

    // Distance to edge between corners fci-1 and fci
    const int fcip = (fci + fcc - 1) % fcc;
    const ON_3dPoint ptPV = pData->m_pMesh->Vertex(face.vi[fcip]);
    ON_Line edge(ptPV, ptV);
    double t = 0.0;
    if (edge.ClosestPointTo(pData->m_pt, &t))
    {
      if (t >= 0.0 && t <= 1.0)
      {
        const ON_3dPoint ptE = edge.PointAt(t);
        const double distE = ptE.DistanceTo(pData->m_pt);
        if (distE < pData->m_dist)
        {
          pData->m_dist = distE;
          pData->m_face_index = fi;
          pData->m_t[0] = pData->m_t[1] = pData->m_t[2] = pData->m_t[3] = 0.0;
          pData->m_t[fci] = t;
          pData->m_t[fcip] = 1.0 - t;
        }
      }
    }
  }

  int tris = 1;
  ON_3dex fcis[2] = { {0, 1, 2}, ON_3dex::Unset };
  //int fcis[2][3] = {{0, 1, 2}, {ON_UNSET_INT_INDEX, ON_UNSET_INT_INDEX, ON_UNSET_INT_INDEX}};
  if (face.IsQuad())
  {
    fcis[1] = { 0, 3, 2 };
    tris = 2;
  }

  for (int ti = 0; ti < tris; ti++)
  {
    const int vis[3] = { face.vi[fcis[ti].i] , face.vi[fcis[ti].j], face.vi[fcis[ti].k] };
    const ON_3dPoint pts[3] = { pData->m_pMesh->Vertex(vis[0]), pData->m_pMesh->Vertex(vis[1]), pData->m_pMesh->Vertex(vis[2]) };
    double t0 = 0.0, t1 = 0.0;
    if (ProjectToFaceSpace(pts[0], pts[1], pts[2], pData->m_pt, t0, t1))
    {
      if (0 <= t0 && 0 <= t1 && t0 + t1 <= 1.0)
      {
        const ON_3dPoint ptF = pts[0] + t0 * (pts[1] - pts[0]) + t1 * (pts[2] - pts[0]);
        const double distF = ptF.DistanceTo(pData->m_pt);
        if (distF < pData->m_dist)
        {
          pData->m_dist = distF;
          pData->m_face_index = fi;
          pData->m_t[0] = pData->m_t[1] = pData->m_t[2] = pData->m_t[3] = 0.0;
          pData->m_t[fcis[ti].i] = 1.0 - t0 - t1;
          pData->m_t[fcis[ti].j] = t0;
          pData->m_t[fcis[ti].k] = t1;
        }
      }
    }
  }

  if (pData->m_dist < pData->m_sphere.m_radius)
  {
    pData->m_sphere.m_radius = pData->m_dist;
    pData->m_bRestart = true;
    return false;
  }

  return true;
}